

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Type __thiscall capnp::SchemaLoader::getType(SchemaLoader *this,Reader proto,Schema scope)

{
  int *__return_storage_ptr__;
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  Reader proto_00;
  Which WVar1;
  Which WVar2;
  uint16_t uVar3;
  uint64_t uVar4;
  Type elementType;
  undefined1 local_278 [8];
  Reader param;
  Reader anyPointer;
  Reader local_210;
  Reader local_1e0;
  Type local_1b0;
  Type local_1a0;
  SchemaLoader *local_190;
  Reader local_188;
  Schema local_158;
  Schema local_150;
  undefined1 local_148 [8];
  Reader interfaceType;
  Reader local_110;
  Schema local_e0;
  Schema local_d8;
  undefined1 local_d0 [8];
  Reader enumType;
  Reader local_98;
  Schema local_68;
  Schema local_60;
  undefined1 local_58 [8];
  Reader structType;
  SchemaLoader *this_local;
  Schema scope_local;
  
  structType._reader._40_8_ = this;
  this_local = (SchemaLoader *)scope.raw;
  WVar1 = capnp::schema::Type::Reader::which(&proto);
  switch(WVar1) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case TEXT:
  case DATA:
    WVar1 = capnp::schema::Type::Reader::which(&proto);
    capnp::Type::Type((Type *)&scope_local,WVar1);
    break;
  case LIST:
    capnp::schema::Type::Reader::getList(&local_210,&proto);
    capnp::schema::Type::List::Reader::getElementType(&local_1e0,&local_210);
    proto_00._reader.capTable = local_1e0._reader.capTable;
    proto_00._reader.segment = local_1e0._reader.segment;
    proto_00._reader.data = local_1e0._reader.data;
    proto_00._reader.pointers = local_1e0._reader.pointers;
    proto_00._reader.dataSize = local_1e0._reader.dataSize;
    proto_00._reader.pointerCount = local_1e0._reader.pointerCount;
    proto_00._reader._38_2_ = local_1e0._reader._38_2_;
    proto_00._reader.nestingLimit = local_1e0._reader.nestingLimit;
    proto_00._reader._44_4_ = local_1e0._reader._44_4_;
    local_1b0 = getType(this,proto_00,(Schema)this_local);
    elementType.field_4 = local_1b0.field_4;
    elementType._0_8_ = elementType.field_4;
    local_1a0 = (Type)ListSchema::of((ListSchema *)local_1b0._0_8_,elementType);
    capnp::Type::Type((Type *)&scope_local,(ListSchema)local_1a0);
    break;
  case ENUM:
    capnp::schema::Type::Reader::getEnum((Reader *)local_d0,&proto);
    uVar4 = capnp::schema::Type::Enum::Reader::getTypeId((Reader *)local_d0);
    capnp::schema::Type::Enum::Reader::getBrand(&local_110,(Reader *)local_d0);
    interfaceType._reader._40_8_ = this_local;
    brand_00._reader.capTable = local_110._reader.capTable;
    brand_00._reader.segment = local_110._reader.segment;
    brand_00._reader.data = local_110._reader.data;
    brand_00._reader.pointers = local_110._reader.pointers;
    brand_00._reader.dataSize = local_110._reader.dataSize;
    brand_00._reader.pointerCount = local_110._reader.pointerCount;
    brand_00._reader._38_2_ = local_110._reader._38_2_;
    brand_00._reader.nestingLimit = local_110._reader.nestingLimit;
    brand_00._reader._44_4_ = local_110._reader._44_4_;
    local_e0 = get(this,uVar4,brand_00,(Schema)this_local);
    local_d8.raw = (RawBrandedSchema *)Schema::asEnum(&local_e0);
    capnp::Type::Type((Type *)&scope_local,(EnumSchema)local_d8.raw);
    break;
  case STRUCT:
    capnp::schema::Type::Reader::getStruct((Reader *)local_58,&proto);
    uVar4 = capnp::schema::Type::Struct::Reader::getTypeId((Reader *)local_58);
    capnp::schema::Type::Struct::Reader::getBrand(&local_98,(Reader *)local_58);
    enumType._reader._40_8_ = this_local;
    brand._reader.capTable = local_98._reader.capTable;
    brand._reader.segment = local_98._reader.segment;
    brand._reader.data = local_98._reader.data;
    brand._reader.pointers = local_98._reader.pointers;
    brand._reader.dataSize = local_98._reader.dataSize;
    brand._reader.pointerCount = local_98._reader.pointerCount;
    brand._reader._38_2_ = local_98._reader._38_2_;
    brand._reader.nestingLimit = local_98._reader.nestingLimit;
    brand._reader._44_4_ = local_98._reader._44_4_;
    local_68 = get(this,uVar4,brand,(Schema)this_local);
    local_60.raw = (RawBrandedSchema *)Schema::asStruct(&local_68);
    capnp::Type::Type((Type *)&scope_local,(StructSchema)local_60.raw);
    break;
  case INTERFACE:
    capnp::schema::Type::Reader::getInterface((Reader *)local_148,&proto);
    uVar4 = capnp::schema::Type::Interface::Reader::getTypeId((Reader *)local_148);
    capnp::schema::Type::Interface::Reader::getBrand(&local_188,(Reader *)local_148);
    local_190 = this_local;
    brand_01._reader.capTable = local_188._reader.capTable;
    brand_01._reader.segment = local_188._reader.segment;
    brand_01._reader.data = local_188._reader.data;
    brand_01._reader.pointers = local_188._reader.pointers;
    brand_01._reader.dataSize = local_188._reader.dataSize;
    brand_01._reader.pointerCount = local_188._reader.pointerCount;
    brand_01._reader._38_2_ = local_188._reader._38_2_;
    brand_01._reader.nestingLimit = local_188._reader.nestingLimit;
    brand_01._reader._44_4_ = local_188._reader._44_4_;
    local_158 = get(this,uVar4,brand_01,(Schema)this_local);
    local_150.raw = (RawBrandedSchema *)Schema::asInterface(&local_158);
    capnp::Type::Type((Type *)&scope_local,(InterfaceSchema)local_150.raw);
    break;
  case ANY_POINTER:
    __return_storage_ptr__ = &param._reader.nestingLimit;
    capnp::schema::Type::Reader::getAnyPointer((Reader *)__return_storage_ptr__,&proto);
    WVar2 = capnp::schema::Type::AnyPointer::Reader::which((Reader *)__return_storage_ptr__);
    if (WVar2 == UNCONSTRAINED) {
      capnp::Type::Type((Type *)&scope_local,ANY_POINTER);
    }
    else if (WVar2 == PARAMETER) {
      capnp::schema::Type::AnyPointer::Reader::getParameter
                ((Reader *)local_278,(Reader *)&param._reader.nestingLimit);
      uVar4 = capnp::schema::Type::AnyPointer::Parameter::Reader::getScopeId((Reader *)local_278);
      uVar3 = capnp::schema::Type::AnyPointer::Parameter::Reader::getParameterIndex
                        ((Reader *)local_278);
      _scope_local = Schema::getBrandBinding((Schema *)&this_local,uVar4,(uint)uVar3);
    }
    else {
      if (WVar2 != IMPLICIT_METHOD_PARAMETER) {
        kj::_::unreachable();
      }
      capnp::Type::Type((Type *)&scope_local,ANY_POINTER);
    }
    break;
  default:
    kj::_::unreachable();
  }
  return _scope_local;
}

Assistant:

Type SchemaLoader::getType(schema::Type::Reader proto, Schema scope) const {
  switch (proto.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return proto.which();

    case schema::Type::STRUCT: {
      auto structType = proto.getStruct();
      return get(structType.getTypeId(), structType.getBrand(), scope).asStruct();
    }

    case schema::Type::ENUM: {
      auto enumType = proto.getEnum();
      return get(enumType.getTypeId(), enumType.getBrand(), scope).asEnum();
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = proto.getInterface();
      return get(interfaceType.getTypeId(), interfaceType.getBrand(), scope)
          .asInterface();
    }

    case schema::Type::LIST:
      return ListSchema::of(getType(proto.getList().getElementType(), scope));

    case schema::Type::ANY_POINTER: {
      auto anyPointer = proto.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return schema::Type::ANY_POINTER;
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          return scope.getBrandBinding(param.getScopeId(), param.getParameterIndex());
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          // We don't support binding implicit method params here.
          return schema::Type::ANY_POINTER;
      }

      KJ_UNREACHABLE;
    }
  }

  KJ_UNREACHABLE;
}